

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O0

void M3x3_ExtractEulerAngles_ZXY(double (*matrix) [3],double *angles)

{
  double *in_RSI;
  double *in_RDI;
  double __x;
  double dVar1;
  double cosX;
  double az;
  double ay;
  double ax;
  double local_28;
  double local_20;
  
  if ((*in_RDI != 9999999.0) || (NAN(*in_RDI))) {
    __x = sqrt(in_RDI[1] * in_RDI[1] + in_RDI[4] * in_RDI[4]);
    dVar1 = atan2(in_RDI[7],__x);
    if (0.0001 <= __x) {
      local_20 = atan2(-in_RDI[6],in_RDI[8]);
      local_28 = atan2(-in_RDI[1],in_RDI[4]);
    }
    else {
      local_20 = atan2(in_RDI[2],*in_RDI);
      local_28 = 0.0;
    }
    *in_RSI = dVar1 * 57.29577951308232;
    in_RSI[1] = local_20 * 57.29577951308232;
    in_RSI[2] = local_28 * 57.29577951308232;
  }
  else {
    *in_RSI = 9999999.0;
    in_RSI[1] = 9999999.0;
    in_RSI[2] = 9999999.0;
  }
  return;
}

Assistant:

void M3x3_ExtractEulerAngles_ZXY(
  double matrix[3][3],
  double angles[3])
{
    double ax,ay,az;
    double cosX;

/*
   R[ZXY] = Rz * Rx * Ry

            | cz   -sz   0 |   | 1    0    0 |   | cy   0   sy |
          = | sz    cz   0 | * | 0   cx  -sx | * |  0   1    0 |
            |  0     0   1 |   | 0   sx   cx |   |-sy   0   cy |


            | cycz - sxsysz    -cxsz    sycz + sxcysz |
          = | cysz + sxsycz     cxcz    sysz - sxcycz |
            |-cxsy              sx      cxcy          |
*/

    if (matrix[0][0] == XEMPTY)
    {
        angles[0] = XEMPTY;
        angles[1] = XEMPTY;
        angles[2] = XEMPTY;
        return;
    }

    cosX = sqrt(matrix[0][1]*matrix[0][1] + matrix[1][1]*matrix[1][1]);

    ax = atan2(matrix[2][1], cosX);

    if (cosX < 0.0001)
    {
     // Gimble lock: set first angle to zero.
     // Assume sx=+-1,cx=0,sz=0,cz=1.0 and decode the matrix accordingly

        ay = atan2(matrix[0][2], matrix[0][0]);
        az = 0.0;
    }
    else
    {
        ay = atan2(-matrix[2][0], matrix[2][2]);
        az = atan2(-matrix[0][1], matrix[1][1]);
    }

    angles[0] = ax * (180.0/M_PI);
    angles[1] = ay * (180.0/M_PI);
    angles[2] = az * (180.0/M_PI);
}